

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void pbrt::rply_message_callback(p_ply ply,char *message)

{
  char *local_8;
  
  local_8 = message;
  Warning<char_const*&>("rply: %s",&local_8);
  return;
}

Assistant:

void rply_message_callback(p_ply ply, const char *message) {
    Warning("rply: %s", message);
}